

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls,U32 hasStep)

{
  uint h;
  uint uVar1;
  U32 *pUVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  int iVar6;
  U32 UVar7;
  uint uVar8;
  uint uVar9;
  U32 UVar10;
  U32 UVar11;
  U32 UVar12;
  BYTE *pBVar13;
  BYTE *iStart;
  BYTE *pBVar14;
  BYTE *iEnd;
  BYTE *pBVar15;
  long lVar16;
  size_t sVar17;
  BYTE *pBVar18;
  BYTE *dst;
  ulong uVar19;
  bool bVar20;
  BYTE *local_428;
  BYTE *local_418;
  BYTE *local_3d8;
  uint local_3c4;
  uint local_3c0;
  uint local_3bc;
  BYTE *local_3b0;
  U32 local_3a4;
  BYTE *local_398;
  U32 local_38c;
  BYTE *local_388;
  BYTE *local_380;
  BYTE *local_378;
  uint local_360;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  BYTE *lowMatchPtr;
  U32 offset;
  U32 mval_1;
  U32 mval;
  U32 rval;
  BYTE *repBase;
  U32 repIndex;
  U32 current2;
  U32 maxRep;
  U32 curr;
  size_t kStepIncr;
  BYTE *nextStep;
  size_t step;
  BYTE *matchEnd;
  size_t mLength;
  BYTE *match0;
  BYTE *pBStack_2d0;
  U32 offcode;
  BYTE *idxBase;
  size_t sStack_2c0;
  U32 idx;
  size_t hash1;
  size_t hash0;
  BYTE *pBStack_2a8;
  U32 current0;
  BYTE *ip3;
  BYTE *ip2;
  BYTE *ip1;
  BYTE *ip0;
  U32 offsetSaved2;
  U32 offsetSaved1;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *dictEnd;
  BYTE *prefixStart;
  U32 prefixStartIndex;
  U32 dictLimit;
  BYTE *dictStart;
  U32 dictStartIndex;
  U32 lowLimit;
  U32 endIndex;
  BYTE *anchor;
  BYTE *istart;
  BYTE *dictBase;
  BYTE *base;
  size_t stepSize;
  U32 hlog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  U32 mls_local;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  size_t local_1b0;
  size_t local_198;
  size_t local_180;
  size_t local_168;
  size_t local_150;
  size_t local_138;
  size_t local_120;
  size_t mlBase_1;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_1;
  ptrdiff_t diff_1;
  
  pUVar2 = ms->hashTable;
  h = (ms->cParams).hashLog;
  pBVar13 = (BYTE *)(ulong)((ms->cParams).targetLength +
                            (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1) + 1);
  pBVar3 = (ms->window).base;
  pBVar4 = (ms->window).dictBase;
  iVar6 = (int)pBVar3;
  UVar7 = ZSTD_getLowestMatchIndex(ms,((int)src - iVar6) + (int)srcSize,(ms->cParams).windowLog);
  local_360 = (ms->window).dictLimit;
  if (local_360 < UVar7) {
    local_360 = UVar7;
  }
  iStart = pBVar3 + local_360;
  pBVar14 = pBVar4 + local_360;
  iEnd = (BYTE *)((long)src + srcSize);
  pBVar15 = iEnd + -8;
  uVar9 = *rep;
  uVar1 = rep[1];
  ip0._4_4_ = 0;
  ip0._0_4_ = 0;
  if (local_360 == UVar7) {
    ms_local = (ZSTD_matchState_t *)ZSTD_compressBlock_fast(ms,seqStore,rep,src,srcSize);
  }
  else {
    uVar8 = ((int)src - iVar6) - UVar7;
    offsetSaved2 = uVar1;
    if (uVar8 <= uVar1) {
      offsetSaved2 = 0;
      ip0._0_4_ = uVar1;
    }
    offsetSaved1 = uVar9;
    _lowLimit = (BYTE *)src;
    if (uVar8 <= uVar9) {
      offsetSaved1 = 0;
      ip0._4_4_ = uVar9;
    }
LAB_00c37124:
    ip1 = _lowLimit;
    kStepIncr = (size_t)(_lowLimit + 0x80);
    ip2 = _lowLimit + 1;
    ip3 = _lowLimit + (long)pBVar13;
    pBStack_2a8 = ip3 + 1;
    if (pBStack_2a8 < pBVar15) {
      if (0x20 < h) {
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      switch(mls) {
      default:
        local_120 = ZSTD_hash4Ptr(_lowLimit,h);
        break;
      case 5:
        local_120 = ZSTD_hash5Ptr(_lowLimit,h);
        break;
      case 6:
        local_120 = ZSTD_hash6Ptr(_lowLimit,h);
        break;
      case 7:
        local_120 = ZSTD_hash7Ptr(_lowLimit,h);
        break;
      case 8:
        local_120 = ZSTD_hash8Ptr(_lowLimit,h);
      }
      hash1 = local_120;
      if (0x20 < h) {
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      switch(mls) {
      default:
        local_138 = ZSTD_hash4Ptr(ip2,h);
        break;
      case 5:
        local_138 = ZSTD_hash5Ptr(ip2,h);
        break;
      case 6:
        local_138 = ZSTD_hash6Ptr(ip2,h);
        break;
      case 7:
        local_138 = ZSTD_hash7Ptr(ip2,h);
        break;
      case 8:
        local_138 = ZSTD_hash8Ptr(ip2,h);
      }
      sStack_2c0 = local_138;
      idxBase._4_4_ = pUVar2[local_120];
      local_378 = pBVar3;
      if (idxBase._4_4_ < local_360) {
        local_378 = pBVar4;
      }
      pBStack_2d0 = local_378;
      nextStep = pBVar13;
      while( true ) {
        pBVar18 = ip2;
        sVar17 = sStack_2c0;
        uVar9 = ((int)ip3 - iVar6) - offsetSaved1;
        local_380 = pBVar3;
        if (uVar9 < local_360) {
          local_380 = pBVar4;
        }
        if (local_360 - uVar9 < 4 || offsetSaved1 == 0) {
          UVar10 = MEM_read32(ip3);
          mval_1 = UVar10 ^ 1;
        }
        else {
          mval_1 = MEM_read32(local_380 + uVar9);
        }
        hash0._4_4_ = (int)ip1 - iVar6;
        pUVar2[hash1] = hash0._4_4_;
        UVar10 = MEM_read32(ip3);
        if (UVar10 == mval_1) {
          local_380 = local_380 + uVar9;
          local_388 = iEnd;
          if (uVar9 < local_360) {
            local_388 = pBVar14;
          }
          step = (size_t)local_388;
          if (local_380 == iStart || local_380 == pBVar4 + UVar7) {
            __assert_fail("(match0 != prefixStart) & (match0 != dictStart)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                          ,0x314,
                          "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                         );
          }
          lVar16 = (long)(int)(uint)(ip3[-1] == local_380[-1]);
          ip1 = ip3 + -lVar16;
          mLength = (long)local_380 - lVar16;
          match0._4_4_ = 1;
          matchEnd = (BYTE *)(lVar16 + 4);
          goto LAB_00c37d54;
        }
        if (idxBase._4_4_ < UVar7) {
          local_38c = MEM_read32(ip1);
          local_38c = local_38c ^ 1;
        }
        else {
          local_38c = MEM_read32(pBStack_2d0 + idxBase._4_4_);
        }
        UVar10 = MEM_read32(ip1);
        if (UVar10 == local_38c) break;
        idxBase._4_4_ = pUVar2[sStack_2c0];
        local_398 = pBVar3;
        if (idxBase._4_4_ < local_360) {
          local_398 = pBVar4;
        }
        pBStack_2d0 = local_398;
        if (0x20 < h) {
          __assert_fail("hBits <= 32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
        }
        switch(mls) {
        default:
          local_150 = ZSTD_hash4Ptr(ip3,h);
          break;
        case 5:
          local_150 = ZSTD_hash5Ptr(ip3,h);
          break;
        case 6:
          local_150 = ZSTD_hash6Ptr(ip3,h);
          break;
        case 7:
          local_150 = ZSTD_hash7Ptr(ip3,h);
          break;
        case 8:
          local_150 = ZSTD_hash8Ptr(ip3,h);
        }
        sStack_2c0 = local_150;
        ip1 = ip2;
        ip2 = ip3;
        hash0._4_4_ = (int)pBVar18 - iVar6;
        pUVar2[sVar17] = hash0._4_4_;
        if (idxBase._4_4_ < UVar7) {
          local_3a4 = MEM_read32(pBVar18);
          local_3a4 = local_3a4 ^ 1;
        }
        else {
          local_3a4 = MEM_read32(local_398 + idxBase._4_4_);
        }
        UVar10 = MEM_read32(pBVar18);
        if (UVar10 == local_3a4) break;
        idxBase._4_4_ = pUVar2[local_150];
        local_3b0 = pBVar3;
        if (idxBase._4_4_ < local_360) {
          local_3b0 = pBVar4;
        }
        pBStack_2d0 = local_3b0;
        hash1 = local_150;
        if (0x20 < h) {
          __assert_fail("hBits <= 32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
        }
        switch(mls) {
        default:
          local_168 = ZSTD_hash4Ptr(pBStack_2a8,h);
          break;
        case 5:
          local_168 = ZSTD_hash5Ptr(pBStack_2a8,h);
          break;
        case 6:
          local_168 = ZSTD_hash6Ptr(pBStack_2a8,h);
          break;
        case 7:
          local_168 = ZSTD_hash7Ptr(pBStack_2a8,h);
          break;
        case 8:
          local_168 = ZSTD_hash8Ptr(pBStack_2a8,h);
        }
        sStack_2c0 = local_168;
        ip1 = ip3;
        ip2 = pBStack_2a8;
        ip3 = ip3 + (long)nextStep;
        pBStack_2a8 = pBStack_2a8 + (long)nextStep;
        if (kStepIncr <= ip3) {
          nextStep = nextStep + 1;
          kStepIncr = kStepIncr + 0x80;
        }
        if (pBVar15 <= pBStack_2a8) goto LAB_00c37afc;
      }
      UVar10 = hash0._4_4_ - idxBase._4_4_;
      local_3d8 = iEnd;
      pBVar18 = iStart;
      if (idxBase._4_4_ < local_360) {
        local_3d8 = pBVar14;
        pBVar18 = pBVar4 + UVar7;
      }
      step = (size_t)local_3d8;
      mLength = (size_t)(pBStack_2d0 + idxBase._4_4_);
      offsetSaved2 = offsetSaved1;
      if (UVar10 == 0) {
        __assert_fail("(offset)>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                      ,0x374,
                      "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                     );
      }
      match0._4_4_ = UVar10 + 3;
      matchEnd = (BYTE *)0x4;
      while( true ) {
        bVar20 = false;
        if (_lowLimit < ip1 && pBVar18 < mLength) {
          bVar20 = ip1[-1] == *(BYTE *)(mLength - 1);
        }
        offsetSaved1 = UVar10;
        if (!bVar20) break;
        ip1 = ip1 + -1;
        mLength = mLength - 1;
        matchEnd = matchEnd + 1;
      }
LAB_00c37d54:
      if (step == 0) {
        __assert_fail("matchEnd != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                      ,0x381,
                      "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                     );
      }
      sVar17 = ZSTD_count_2segments
                         (ip1 + (long)matchEnd,matchEnd + mLength,iEnd,(BYTE *)step,iStart);
      pBVar18 = matchEnd + sVar17;
      uVar19 = (long)ip1 - (long)_lowLimit;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar19) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (iEnd < _lowLimit + uVar19) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a1,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (iEnd + -0x20 < _lowLimit + uVar19) {
        ZSTD_safecopyLiterals(seqStore->lit,_lowLimit,_lowLimit + uVar19,iEnd + -0x20);
      }
      else {
        ZSTD_copy16(seqStore->lit,_lowLimit);
        if (0x10 < uVar19) {
          pBVar5 = seqStore->lit;
          dst = pBVar5 + 0x10;
          lVar16 = (long)dst - (long)(_lowLimit + 0x10);
          if ((lVar16 < 0x10) && (-0x10 < lVar16)) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                          ,0xe9,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(dst,_lowLimit + 0x10);
          if (0x10 < (long)(uVar19 - 0x10)) {
            oend = pBVar5 + 0x20;
            do {
              op = _lowLimit + 0x20;
              ZSTD_copy16(oend,op);
              ZSTD_copy16(oend + 0x10,_lowLimit + 0x30);
              oend = oend + 0x20;
              _lowLimit = op;
            } while (oend < dst + (uVar19 - 0x10));
          }
        }
      }
      seqStore->lit = seqStore->lit + uVar19;
      if (0xffff < uVar19) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->litLength = (U16)uVar19;
      seqStore->sequences->offBase = match0._4_4_;
      if (pBVar18 < (BYTE *)0x3) {
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,700,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if ((BYTE *)0xffff < pBVar18 + -3) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2bf,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->mlBase = (U16)(pBVar18 + -3);
      seqStore->sequences = seqStore->sequences + 1;
      _lowLimit = pBVar18 + (long)ip1;
      if (ip2 < _lowLimit) {
        pUVar2[sStack_2c0] = (int)ip2 - iVar6;
      }
      if (_lowLimit <= pBVar15) {
        if (pBVar3 + (ulong)hash0._4_4_ + 2 <= src) {
          __assert_fail("base+current0+2 > istart",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                        ,0x391,
                        "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                       );
        }
        pBVar18 = pBVar3 + (ulong)hash0._4_4_ + 2;
        if (0x20 < h) {
          __assert_fail("hBits <= 32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
        }
        switch(mls) {
        default:
          local_180 = ZSTD_hash4Ptr(pBVar18,h);
          break;
        case 5:
          local_180 = ZSTD_hash5Ptr(pBVar18,h);
          break;
        case 6:
          local_180 = ZSTD_hash6Ptr(pBVar18,h);
          break;
        case 7:
          local_180 = ZSTD_hash7Ptr(pBVar18,h);
          break;
        case 8:
          local_180 = ZSTD_hash8Ptr(pBVar18,h);
        }
        pUVar2[local_180] = hash0._4_4_ + 2;
        pBVar18 = _lowLimit + -2;
        if (0x20 < h) {
          __assert_fail("hBits <= 32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
        }
        switch(mls) {
        default:
          local_198 = ZSTD_hash4Ptr(pBVar18,h);
          break;
        case 5:
          local_198 = ZSTD_hash5Ptr(pBVar18,h);
          break;
        case 6:
          local_198 = ZSTD_hash6Ptr(pBVar18,h);
          break;
        case 7:
          local_198 = ZSTD_hash7Ptr(pBVar18,h);
          break;
        case 8:
          local_198 = ZSTD_hash8Ptr(pBVar18,h);
        }
        pUVar2[local_198] = ((int)_lowLimit + -2) - iVar6;
        for (; UVar10 = offsetSaved2, _lowLimit <= pBVar15; _lowLimit = _lowLimit + sVar17 + 4) {
          uVar9 = ((int)_lowLimit - iVar6) - offsetSaved2;
          if (uVar9 < local_360) {
            local_418 = pBVar4 + uVar9;
          }
          else {
            local_418 = pBVar3 + uVar9;
          }
          if ((local_360 - 1) - uVar9 < 3 || offsetSaved2 == 0) break;
          UVar11 = MEM_read32(local_418);
          UVar12 = MEM_read32(_lowLimit);
          if (UVar11 != UVar12) break;
          local_428 = iEnd;
          if (uVar9 < local_360) {
            local_428 = pBVar14;
          }
          sVar17 = ZSTD_count_2segments(_lowLimit + 4,local_418 + 4,iEnd,local_428,iStart);
          offsetSaved2 = offsetSaved1;
          offsetSaved1 = UVar10;
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x29d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x29f,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (iEnd < _lowLimit) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2a1,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (iEnd + -0x20 < _lowLimit) {
            ZSTD_safecopyLiterals(seqStore->lit,_lowLimit,_lowLimit,iEnd + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,_lowLimit);
          }
          seqStore->lit = seqStore->lit;
          seqStore->sequences->litLength = 0;
          seqStore->sequences->offBase = 1;
          if (sVar17 + 4 < 3) {
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,700,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0xffff < sVar17 + 1) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2bf,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->mlBase = (U16)(sVar17 + 1);
          seqStore->sequences = seqStore->sequences + 1;
          if (0x20 < h) {
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
          }
          switch(mls) {
          default:
            local_1b0 = ZSTD_hash4Ptr(_lowLimit,h);
            break;
          case 5:
            local_1b0 = ZSTD_hash5Ptr(_lowLimit,h);
            break;
          case 6:
            local_1b0 = ZSTD_hash6Ptr(_lowLimit,h);
            break;
          case 7:
            local_1b0 = ZSTD_hash7Ptr(_lowLimit,h);
            break;
          case 8:
            local_1b0 = ZSTD_hash8Ptr(_lowLimit,h);
          }
          pUVar2[local_1b0] = (int)_lowLimit - iVar6;
        }
      }
      goto LAB_00c37124;
    }
LAB_00c37afc:
    if ((ip0._4_4_ == 0) || (offsetSaved1 == 0)) {
      local_3bc = (uint)ip0;
    }
    else {
      local_3bc = ip0._4_4_;
    }
    if (offsetSaved1 == 0) {
      local_3c0 = ip0._4_4_;
    }
    else {
      local_3c0 = offsetSaved1;
    }
    *rep = local_3c0;
    if (offsetSaved2 == 0) {
      local_3c4 = local_3bc;
    }
    else {
      local_3c4 = offsetSaved2;
    }
    rep[1] = local_3c4;
    ms_local = (ZSTD_matchState_t *)(iEnd + -(long)_lowLimit);
  }
  return (size_t)ms_local;
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls, U32 const hasStep)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    size_t const stepSize = cParams->targetLength + !(cParams->targetLength) + 1;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* anchor = istart;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = dictLimit < lowLimit ? lowLimit : dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];
    U32 offsetSaved1 = 0, offsetSaved2 = 0;

    const BYTE* ip0 = istart;
    const BYTE* ip1;
    const BYTE* ip2;
    const BYTE* ip3;
    U32 current0;


    size_t hash0; /* hash for ip0 */
    size_t hash1; /* hash for ip1 */
    U32 idx; /* match idx for ip0 */
    const BYTE* idxBase; /* base pointer for idx */

    U32 offcode;
    const BYTE* match0;
    size_t mLength;
    const BYTE* matchEnd = 0; /* initialize to avoid warning, assert != 0 later */

    size_t step;
    const BYTE* nextStep;
    const size_t kStepIncr = (1 << (kSearchStrength - 1));

    (void)hasStep; /* not currently specialized on whether it's accelerated */

    DEBUGLOG(5, "ZSTD_compressBlock_fast_extDict_generic (offset_1=%u)", offset_1);

    /* switch to "regular" variant if extDict is invalidated due to maxDistance */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_fast(ms, seqStore, rep, src, srcSize);

    {   U32 const curr = (U32)(ip0 - base);
        U32 const maxRep = curr - dictStartIndex;
        if (offset_2 >= maxRep) offsetSaved2 = offset_2, offset_2 = 0;
        if (offset_1 >= maxRep) offsetSaved1 = offset_1, offset_1 = 0;
    }

    /* start each op */
_start: /* Requires: ip0 */

    step = stepSize;
    nextStep = ip0 + kStepIncr;

    /* calculate positions, ip0 - anchor == 0, so we skip step calc */
    ip1 = ip0 + 1;
    ip2 = ip0 + step;
    ip3 = ip2 + 1;

    if (ip3 >= ilimit) {
        goto _cleanup;
    }

    hash0 = ZSTD_hashPtr(ip0, hlog, mls);
    hash1 = ZSTD_hashPtr(ip1, hlog, mls);

    idx = hashTable[hash0];
    idxBase = idx < prefixStartIndex ? dictBase : base;

    do {
        {   /* load repcode match for ip[2] */
            U32 const current2 = (U32)(ip2 - base);
            U32 const repIndex = current2 - offset_1;
            const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
            U32 rval;
            if ( ((U32)(prefixStartIndex - repIndex) >= 4) /* intentional underflow */
                 & (offset_1 > 0) ) {
                rval = MEM_read32(repBase + repIndex);
            } else {
                rval = MEM_read32(ip2) ^ 1; /* guaranteed to not match. */
            }

            /* write back hash table entry */
            current0 = (U32)(ip0 - base);
            hashTable[hash0] = current0;

            /* check repcode at ip[2] */
            if (MEM_read32(ip2) == rval) {
                ip0 = ip2;
                match0 = repBase + repIndex;
                matchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
                assert((match0 != prefixStart) & (match0 != dictStart));
                mLength = ip0[-1] == match0[-1];
                ip0 -= mLength;
                match0 -= mLength;
                offcode = REPCODE1_TO_OFFBASE;
                mLength += 4;
                goto _match;
        }   }

        {   /* load match for ip[0] */
            U32 const mval = idx >= dictStartIndex ?
                    MEM_read32(idxBase + idx) :
                    MEM_read32(ip0) ^ 1; /* guaranteed not to match */

            /* check match at ip[0] */
            if (MEM_read32(ip0) == mval) {
                /* found a match! */
                goto _offset;
        }   }

        /* lookup ip[1] */
        idx = hashTable[hash1];
        idxBase = idx < prefixStartIndex ? dictBase : base;

        /* hash ip[2] */
        hash0 = hash1;
        hash1 = ZSTD_hashPtr(ip2, hlog, mls);

        /* advance to next positions */
        ip0 = ip1;
        ip1 = ip2;
        ip2 = ip3;

        /* write back hash table entry */
        current0 = (U32)(ip0 - base);
        hashTable[hash0] = current0;

        {   /* load match for ip[0] */
            U32 const mval = idx >= dictStartIndex ?
                    MEM_read32(idxBase + idx) :
                    MEM_read32(ip0) ^ 1; /* guaranteed not to match */

            /* check match at ip[0] */
            if (MEM_read32(ip0) == mval) {
                /* found a match! */
                goto _offset;
        }   }

        /* lookup ip[1] */
        idx = hashTable[hash1];
        idxBase = idx < prefixStartIndex ? dictBase : base;

        /* hash ip[2] */
        hash0 = hash1;
        hash1 = ZSTD_hashPtr(ip2, hlog, mls);

        /* advance to next positions */
        ip0 = ip1;
        ip1 = ip2;
        ip2 = ip0 + step;
        ip3 = ip1 + step;

        /* calculate step */
        if (ip2 >= nextStep) {
            step++;
            PREFETCH_L1(ip1 + 64);
            PREFETCH_L1(ip1 + 128);
            nextStep += kStepIncr;
        }
    } while (ip3 < ilimit);

_cleanup:
    /* Note that there are probably still a couple positions we could search.
     * However, it seems to be a meaningful performance hit to try to search
     * them. So let's not. */

    /* If offset_1 started invalid (offsetSaved1 != 0) and became valid (offset_1 != 0),
     * rotate saved offsets. See comment in ZSTD_compressBlock_fast_noDict for more context. */
    offsetSaved2 = ((offsetSaved1 != 0) && (offset_1 != 0)) ? offsetSaved1 : offsetSaved2;

    /* save reps for next block */
    rep[0] = offset_1 ? offset_1 : offsetSaved1;
    rep[1] = offset_2 ? offset_2 : offsetSaved2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);

_offset: /* Requires: ip0, idx, idxBase */

    /* Compute the offset code. */
    {   U32 const offset = current0 - idx;
        const BYTE* const lowMatchPtr = idx < prefixStartIndex ? dictStart : prefixStart;
        matchEnd = idx < prefixStartIndex ? dictEnd : iend;
        match0 = idxBase + idx;
        offset_2 = offset_1;
        offset_1 = offset;
        offcode = OFFSET_TO_OFFBASE(offset);
        mLength = 4;

        /* Count the backwards match length. */
        while (((ip0>anchor) & (match0>lowMatchPtr)) && (ip0[-1] == match0[-1])) {
            ip0--;
            match0--;
            mLength++;
    }   }

_match: /* Requires: ip0, match0, offcode, matchEnd */

    /* Count the forward length. */
    assert(matchEnd != 0);
    mLength += ZSTD_count_2segments(ip0 + mLength, match0 + mLength, iend, matchEnd, prefixStart);

    ZSTD_storeSeq(seqStore, (size_t)(ip0 - anchor), anchor, iend, offcode, mLength);

    ip0 += mLength;
    anchor = ip0;

    /* write next hash table entry */
    if (ip1 < ip0) {
        hashTable[hash1] = (U32)(ip1 - base);
    }

    /* Fill table and check for immediate repcode. */
    if (ip0 <= ilimit) {
        /* Fill Table */
        assert(base+current0+2 > istart);  /* check base overflow */
        hashTable[ZSTD_hashPtr(base+current0+2, hlog, mls)] = current0+2;  /* here because current+2 could be > iend-8 */
        hashTable[ZSTD_hashPtr(ip0-2, hlog, mls)] = (U32)(ip0-2-base);

        while (ip0 <= ilimit) {
            U32 const repIndex2 = (U32)(ip0-base) - offset_2;
            const BYTE* const repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
            if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (offset_2 > 0))  /* intentional underflow */
                 && (MEM_read32(repMatch2) == MEM_read32(ip0)) ) {
                const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                size_t const repLength2 = ZSTD_count_2segments(ip0+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                { U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset; }  /* swap offset_2 <=> offset_1 */
                ZSTD_storeSeq(seqStore, 0 /*litlen*/, anchor, iend, REPCODE1_TO_OFFBASE, repLength2);
                hashTable[ZSTD_hashPtr(ip0, hlog, mls)] = (U32)(ip0-base);
                ip0 += repLength2;
                anchor = ip0;
                continue;
            }
            break;
    }   }

    goto _start;
}